

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimum.cpp
# Opt level: O2

void __thiscall Minimum<1>::Minimum(Minimum<1> *this,vec<IntView<1>_> *_x,IntView<1> _y)

{
  IntView<1> *pIVar1;
  long *plVar2;
  IntVar *pIVar3;
  int i;
  ulong uVar4;
  long lVar5;
  
  Propagator::Propagator(&this->super_Propagator);
  Checker::Checker(&this->super_Checker);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_001f0378;
  (this->super_Checker)._vptr_Checker = (_func_int **)&DAT_001f03e0;
  this->sz = _x->sz;
  pIVar1 = _x->data;
  _x->sz = 0;
  _x->cap = 0;
  _x->data = (IntView<1> *)0x0;
  this->x = pIVar1;
  (this->y).var = _y.var;
  (this->y).a = (int)_y._8_8_;
  (this->y).b = (int)((ulong)_y._8_8_ >> 0x20);
  (this->min_max_var).v = -1;
  (this->min_max).v = 0x7fffffff;
  (this->min_fixed).v = 0x7fffffff;
  this->lower_change = false;
  (this->super_Propagator).priority = 1;
  lVar5 = 0;
  for (uVar4 = 0; (long)uVar4 < (long)this->sz; uVar4 = uVar4 + 1) {
    plVar2 = *(long **)((long)&this->x->var + lVar5);
    (**(code **)(*plVar2 + 0x38))(plVar2,this,uVar4 & 0xffffffff,6);
    lVar5 = lVar5 + 0x10;
  }
  pIVar3 = (this->y).var;
  (*(pIVar3->super_Var).super_Branching._vptr_Branching[7])(pIVar3,this,(long)this->sz,4);
  return;
}

Assistant:

Minimum(vec<IntView<U> > _x, IntView<U> _y)
			: sz(_x.size()),
				x(_x.release()),
				y(_y),
				min_max_var(-1),
				min_max(INT_MAX),
				min_fixed(INT_MAX) {
		priority = 1;
		for (int i = 0; i < sz; i++) {
			x[i].attach(this, i, EVENT_LU);
		}
		y.attach(this, sz, EVENT_L);
	}